

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::emit_select_instruction(Impl *impl,SelectInst *instruction)

{
  bool bVar1;
  Id arg;
  Operation *op_00;
  Value *value;
  Type *type;
  uint local_2c;
  uint i;
  Operation *op;
  SelectInst *instruction_local;
  Impl *impl_local;
  
  bVar1 = emit_peephole_findmsb(impl,&instruction->super_Instruction);
  if (!bVar1) {
    op_00 = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,local_2c);
      arg = Converter::Impl::get_id_for_value(impl,value,0);
      Operation::add_id(op_00,arg);
    }
    Converter::Impl::add(impl,op_00,false);
    type = LLVMBC::Value::getType((Value *)instruction);
    Converter::Impl::decorate_relaxed_precision(impl,type,op_00->id,false);
  }
  return true;
}

Assistant:

bool emit_select_instruction(Converter::Impl &impl, const llvm::SelectInst *instruction)
{
	if (emit_peephole_findmsb(impl, instruction))
		return true;

	Operation *op = impl.allocate(spv::OpSelect, instruction);

	for (unsigned i = 0; i < 3; i++)
		op->add_id(impl.get_id_for_value(instruction->getOperand(i)));

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}